

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

SP __thiscall pbrt::QuadMesh::makeFrom(QuadMesh *this,SP *tris)

{
  ulong uVar1;
  pointer *ppvVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  pointer pvVar6;
  element_type *peVar7;
  ulong uVar8;
  pointer pvVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  iterator iVar12;
  ulong uVar13;
  SP SVar14;
  SP out;
  vec4i local_68;
  element_type *local_50;
  element_type *local_48;
  SP local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  
  std::__shared_ptr<pbrt::QuadMesh,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::QuadMesh>,std::shared_ptr<pbrt::Material>&>
            ((__shared_ptr<pbrt::QuadMesh,(__gnu_cxx::_Lock_policy)2> *)&local_50,
             (allocator<pbrt::QuadMesh> *)&local_68,
             &(((tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Shape).material);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  ::operator=(&(local_50->super_Shape).textures._M_t,
              &(((tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->super_Shape).textures._M_t);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator=
            (&local_50->vertex,
             &((tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              vertex);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator=
            (&local_50->normal,
             &((tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              normal);
  peVar10 = (tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pvVar9 = (peVar10->index).
           super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar6 = (peVar10->index).
           super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar8 = ((long)pvVar6 - (long)pvVar9 >> 2) * -0x5555555555555555;
  if (pvVar6 != pvVar9) {
    uVar13 = 0;
    do {
      local_68.x = pvVar9[uVar13].x;
      uVar3 = pvVar9[uVar13].y;
      uVar4 = pvVar9[uVar13].z;
      uVar1 = uVar13 + 1;
      local_68.y = uVar3;
      local_68.z = uVar4;
      if (uVar1 < uVar8) {
        local_68.w = pvVar9[uVar1].y;
        iVar5 = pvVar9[uVar1].z;
        if ((pvVar9[uVar1].x == local_68.x) && (local_68.w == uVar4)) {
          iVar12._M_current =
               (local_50->index).
               super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_68.w = iVar5;
          if (iVar12._M_current ==
              (local_50->index).
              super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::
            _M_realloc_insert<pbrt::math::vec4i>(&local_50->index,iVar12,&local_68);
            uVar13 = uVar1;
          }
          else {
LAB_00144da3:
            (iVar12._M_current)->x = local_68.x;
            (iVar12._M_current)->y = uVar3;
            (iVar12._M_current)->z = uVar4;
            (iVar12._M_current)->w = local_68.w;
            ppvVar2 = &(local_50->index).
                       super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppvVar2 = *ppvVar2 + 1;
            uVar13 = uVar1;
          }
        }
        else {
          if ((pvVar9[uVar1].x != uVar4) || (iVar5 != local_68.x)) goto LAB_00144db6;
          iVar12._M_current =
               (local_50->index).
               super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current !=
              (local_50->index).
              super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_00144da3;
          std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::
          _M_realloc_insert<pbrt::math::vec4i>(&local_50->index,iVar12,&local_68);
          uVar13 = uVar1;
        }
      }
      else {
LAB_00144db6:
        iVar12._M_current =
             (local_50->index).
             super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_68.w = uVar4;
        if (iVar12._M_current ==
            (local_50->index).
            super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::
          _M_realloc_insert<pbrt::math::vec4i>(&local_50->index,iVar12,&local_68);
        }
        else {
          (iVar12._M_current)->x = local_68.x;
          (iVar12._M_current)->y = uVar3;
          (iVar12._M_current)->z = uVar4;
          (iVar12._M_current)->w = uVar4;
          ppvVar2 = &(local_50->index).
                     super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppvVar2 = *ppvVar2 + 1;
        }
      }
      uVar13 = uVar13 + 1;
      peVar10 = (tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pvVar9 = (peVar10->index).
               super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = ((long)(peVar10->index).
                     super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pvVar9 >> 2) *
              -0x5555555555555555;
    } while (uVar13 < uVar8);
  }
  peVar7 = local_48;
  _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar8 * 3);
  if (((long)(peVar10->vertex).
             super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(peVar10->vertex).
             super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 + uVar8 * -3 == 0) {
    local_40.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_50;
    local_40.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
    if (local_48 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(local_48->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                 super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(local_48->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                      super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(local_48->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                 super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(local_48->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                      super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      }
    }
    SVar14 = remeshVertices((pbrt *)this,&local_40);
    _Var11 = SVar14.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if ((element_type *)
        local_40.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
      _Var11._M_pi = extraout_RDX;
    }
  }
  else {
    (this->super_Shape).super_Entity._vptr_Entity = (_func_int **)local_50;
    local_48 = (element_type *)0x0;
    (this->super_Shape).super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
    super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    local_50 = (element_type *)0x0;
  }
  if (local_48 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
    _Var11._M_pi = extraout_RDX_00;
  }
  SVar14.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  SVar14.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (SP)SVar14.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QuadMesh::SP QuadMesh::makeFrom(TriangleMesh::SP tris)
  {
    QuadMesh::SP out = std::make_shared<QuadMesh>(tris->material);
    out->textures = tris->textures;
    // out->texcoord = in->texcoord;
    out->vertex   = tris->vertex;
    out->normal   = tris->normal;
      
    for (size_t i=0;i<tris->index.size();i++) {
      vec3i idx0 = tris->index[i+0];
      if ((i+1) < tris->index.size()) {
        vec3i idx1 = tris->index[i+1];
        if (idx1.x == idx0.x && idx1.y == idx0.z) {
          // could merge!!!
          out->index.push_back(vec4i(idx0.x,idx0.y,idx0.z,idx1.z));
          ++i;
          continue;
        }
        if (idx1.x == idx0.z && idx1.z == idx0.x) {
          // could merge!!!
          out->index.push_back(vec4i(idx0.x,idx0.y,idx0.z,idx1.y));
          ++i;
          continue;
        }
      }
      // could not merge :-( - emit tri as degenerate quad
      out->index.push_back(vec4i(idx0.x,idx0.y,idx0.z,idx0.z));
    }
      
    if (tris->vertex.size() == 3*tris->index.size()) {
      return remeshVertices(out);
    }
    else
      return out;
  }